

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

void rndmappos(xchar *x,xchar *y)

{
  char cVar1;
  uint uVar2;
  char cVar3;
  xchar xVar4;
  
  cVar1 = *x;
  cVar3 = 'P';
  if (cVar1 < 'P') {
    if (cVar1 == -1) {
      uVar2 = mt_random();
      cVar3 = (char)((ulong)uVar2 % 0x4f) + '\x01';
    }
    else {
      if ('\0' < cVar1) goto LAB_001a62be;
      cVar3 = '\x01';
    }
  }
  *x = cVar3;
LAB_001a62be:
  cVar1 = *y;
  xVar4 = '\x15';
  if (cVar1 < '\x15') {
    if (cVar1 == -1) {
      uVar2 = mt_random();
      xVar4 = (xchar)((ulong)uVar2 % 0x15);
    }
    else {
      if (-1 < cVar1) {
        return;
      }
      xVar4 = '\0';
    }
  }
  *y = xVar4;
  return;
}

Assistant:

static void rndmappos(xchar *x, xchar *y)
{
	if (*x >= COLNO) *x = COLNO;
	else if (*x == -1) *x = rn2(COLNO - 1) + 1;
	else if (*x < 1) *x = 1;

	if (*y >= ROWNO) *y = ROWNO;
	else if (*y == -1) *y = rn2(ROWNO);
	else if (*y < 0) *y = 0;
}